

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void ngai_nbgets(char *loc_base_ptr,char *prem,int *stride_rem,char *pbuf,int *stride_loc,int *count
                ,int nstrides,int proc,int field_off,int field_size,int type_size,
                armci_hdl_t *nbhandle)

{
  ulong uVar1;
  
  if (field_size < 0 || field_size == type_size) {
    ARMCI_NbGetS(prem,stride_rem,pbuf,stride_loc,count,nstrides,proc,nbhandle);
  }
  else {
    *count = *count / type_size;
    if (0 < nstrides) {
      uVar1 = 0;
      do {
        stride_loc[uVar1] = (stride_loc[uVar1] / type_size) * field_size;
        uVar1 = uVar1 + 1;
      } while ((uint)nstrides != uVar1);
    }
    ARMCI_NbGetS(prem + field_off,stride_rem + -1,
                 loc_base_ptr +
                 (ulong)(uint)field_size * (((long)pbuf - (long)loc_base_ptr) / (long)type_size),
                 stride_loc + -1,count + -1,nstrides + 1,proc,nbhandle);
    *count = *count * type_size;
    if (0 < nstrides) {
      uVar1 = 0;
      do {
        stride_loc[uVar1] = (stride_loc[uVar1] / field_size) * type_size;
        uVar1 = uVar1 + 1;
      } while ((uint)nstrides != uVar1);
    }
  }
  return;
}

Assistant:

static void ngai_nbgets(char *loc_base_ptr, char *prem,int *stride_rem, char *pbuf, int *stride_loc,
			int *count, int nstrides, int proc, int field_off, 
			int field_size, int type_size, armci_hdl_t *nbhandle) {
  if(field_size<0 || field_size == type_size) {
    ARMCI_NbGetS(prem,stride_rem,pbuf,stride_loc,count,nstrides,proc,nbhandle);
  }
  else {
    int i;
    count -= 1;
    stride_loc -= 1;
    stride_rem -= 1;

    pbuf = loc_base_ptr + (pbuf - loc_base_ptr)/type_size*field_size;
    prem += field_off;

    count[1] /= type_size; 
    nstrides += 1;

    for(i=1; i<nstrides; i++) {
      stride_loc[i] /= type_size;
      stride_loc[i] *= field_size;
    }
/*     { */
/*       int i; */
/*       printf("%s: calling armci_nbgets: field_off=%d field_size=%d type_size=%d proc=%d nstrides=%d\n",  */
/* 	     __FUNCTION__, (int)field_off, (int)field_size, (int)type_size, proc, nstrides); */
/*       printf("me=%d loc_ptr=%p rem_ptr=%p count=[", pnga_nodeid(), pbuf, prem); */
/*       for(i=0; i<=nstrides; i++) { */
/* 	printf("%d ",count[i]); */
/*       } */
/*       printf("]\n"); */
/*       printf("src_stride_arr=["); */
/*       for(i=0; i<nstrides; i++) { */
/* 	printf("%d ",stride_rem[i]); */
/*       } */
/*       printf("]\n"); */
/*       printf("dst_stride_arr=["); */
/*       for(i=0; i<nstrides; i++) { */
/* 	printf("%d ",stride_loc[i]); */
/*       } */
/*       printf("]\n"); */
/*     } */
    ARMCI_NbGetS(prem,stride_rem,pbuf,stride_loc,count,nstrides,proc,nbhandle);
    count[1] *= type_size; /*restore*/
    for(i=1; i<nstrides; i++) {
      stride_loc[i] /= field_size;
      stride_loc[i] *= type_size;
    }
  }
}